

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

void __thiscall flatbuffers::FlatBufPrinter::Print(FlatBufPrinter *this,char *s)

{
  string *psVar1;
  char *pcVar2;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if ((s != (char *)0x0) && (*s != '\0')) {
    do {
      psVar1 = this->str_;
      std::__cxx11::string::insert
                (psVar1,(psVar1->_M_dataplus)._M_p + psVar1->_M_string_length,
                 this->indentation_size_ * this->indent_,(int)this->indentation_type_);
      pcVar2 = strchr(s,10);
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::string::append((char *)this->str_);
        return;
      }
      pcVar2 = pcVar2 + 1;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,s,pcVar2);
      std::__cxx11::string::append((string *)this->str_);
      std::__cxx11::string::~string((string *)local_50);
      s = pcVar2;
    } while (*pcVar2 != '\0');
  }
  return;
}

Assistant:

void Print(const char *s) {
    if (s == nullptr || *s == '\0') { return; }
    // Add this string, but for each part separated by \n, add indentation.
    for (;;) {
      // Current indentation.
      str_->insert(str_->end(), indent_ * indentation_size_, indentation_type_);
      // See if this contains more than one line.
      const char *lf = strchr(s, '\n');
      if (lf) {
        (*str_) += std::string(s, lf + 1);
        s = lf + 1;
        if (!*s) break;  // Only continue if there's more lines.
      } else {
        (*str_) += s;
        break;
      }
    }
  }